

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::FactorAlternationImpl::Round2
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  bool bVar1;
  Regexp *b;
  Regexp *pRVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  int iVar4;
  ulong uVar5;
  Regexp *pRVar6;
  long lVar7;
  ulong uVar8;
  Regexp *prefix;
  int local_54;
  long local_50;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_48;
  Regexp **local_40;
  Regexp *local_38;
  
  lVar7 = (long)nsub;
  uVar8 = 0;
  uVar5 = 0;
  pRVar2 = (Regexp *)0x0;
  local_50 = lVar7;
  local_48 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
  do {
    if (lVar7 < (long)uVar8) {
      return;
    }
    b = pRVar2;
    if (((long)uVar8 < lVar7) && (b = Regexp::LeadingRegexp(sub[uVar8]), pRVar2 != (Regexp *)0x0)) {
      if (8 < pRVar2->op_ - 0xc) {
        if ((pRVar2->op_ == 10) &&
           ((pRVar2->field_7).field_0.min_ == (pRVar2->field_7).field_0.max_)) {
          if (pRVar2->nsub_ < 2) {
            paVar3 = &pRVar2->field_5;
          }
          else {
            paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
          }
          if ((paVar3->subone_->op_ < 0x15) &&
             ((0x103008U >> (paVar3->subone_->op_ & 0x1f) & 1) != 0)) goto LAB_001b8640;
        }
        goto LAB_001b864f;
      }
LAB_001b8640:
      bVar1 = Regexp::Equal(pRVar2,b);
      pRVar6 = pRVar2;
      if (!bVar1) goto LAB_001b864f;
    }
    else {
LAB_001b864f:
      pRVar6 = b;
      iVar4 = (int)uVar5;
      if (uVar8 != iVar4 + 1 && uVar8 != uVar5) {
        local_38 = Regexp::Incref(pRVar2);
        for (lVar7 = (long)iVar4; lVar7 < (long)uVar8; lVar7 = lVar7 + 1) {
          pRVar2 = Regexp::RemoveLeadingRegexp(sub[lVar7]);
          sub[lVar7] = pRVar2;
        }
        local_40 = sub + iVar4;
        local_54 = (int)uVar8 - iVar4;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>(local_48,&local_38,&local_40,&local_54);
        lVar7 = local_50;
      }
      if ((long)uVar8 < lVar7) {
        uVar5 = uVar8 & 0xffffffff;
      }
    }
    uVar8 = uVar8 + 1;
    pRVar2 = pRVar6;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round2(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with first.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = Regexp::LeadingRegexp(sub[i]);
      if (first != NULL &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte))) &&
          Regexp::Equal(first, first_i))
        continue;
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first,
    // but sub[i] does not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = Regexp::RemoveLeadingRegexp(sub[j]);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}